

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::operator==(SilentEntitySystem *this,SilentEntitySystem *Value)

{
  EntityAppearance *pEVar1;
  KBOOL KVar2;
  EntityAppearance *this_00;
  EntityAppearance *Value_00;
  
  if (this->m_ui16NumEnts != Value->m_ui16NumEnts) {
    return false;
  }
  if ((this->m_ui16NumOfAppearanceRecords == Value->m_ui16NumOfAppearanceRecords) &&
     (KVar2 = EntityType::operator!=(&this->m_EntTyp,&Value->m_EntTyp), !KVar2)) {
    this_00 = (this->m_vEA).
              super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->m_vEA).
             super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->m_vEA).
               super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pEVar1 - (long)this_00 ==
        (long)(Value->m_vEA).
              super__Vector_base<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pEVar1) {
        return this_00 == pEVar1;
      }
      KVar2 = DATA_TYPE::EntityAppearance::operator==(this_00,Value_00);
      if (KVar2) {
        do {
          Value_00 = Value_00 + 1;
          this_00 = this_00 + 1;
          if (this_00 == pEVar1) {
            return this_00 == pEVar1;
          }
          KVar2 = DATA_TYPE::EntityAppearance::operator==(this_00,Value_00);
        } while (KVar2);
        return false;
      }
    }
  }
  return false;
}

Assistant:

KBOOL SilentEntitySystem::operator == ( const SilentEntitySystem & Value ) const
{
    if( m_ui16NumEnts                 != Value.m_ui16NumEnts )                return false;
    if( m_ui16NumOfAppearanceRecords  != Value.m_ui16NumOfAppearanceRecords ) return false;
    if( m_EntTyp                      != Value.m_EntTyp )                     return false;
    if( m_vEA                         != Value.m_vEA )                        return false;
    return true;
}